

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_tpl_varnames_h.cc
# Opt level: O0

void Usage(char *argv0,FILE *outfile)

{
  FILE *outfile_local;
  char *argv0_local;
  
  fprintf((FILE *)outfile,
          "USAGE: %s [-t<dir>] [-o<dir>] [-s<suffix>] [-f<filename>] [-n] [-d] [-q] <template_filename> ...\n"
          ,argv0);
  fprintf((FILE *)outfile,
          "       -t<dir> --template_dir=<dir>  Root directory of templates\n       -o<dir> --header_dir=<dir>    Where to place output files\n       -s<suffix> --outputfile_suffix=<suffix>\n                                     outname = inname + suffix\n       -f<filename> --outputfile=<filename>\n                                     outname = filename (when given, \n                                     --header_dir is ignored)\n       -n --noheader                 Just check syntax, no output\n       -d --dump_templates           Cause templates dump contents\n       -q --nolog_info               Only log on error\n          --v=-1                     Obsolete, confusing synonym for -q\n       -h --help                     This help\n       -V --version                  Version information\n"
         );
  fprintf((FILE *)outfile,
          "\nThis program checks the syntax of one or more google templates.\nBy default (without -n) it also emits a header file to an output\ndirectory that defines all valid template keys.  This can be used\nin programs to minimze the probability of typos in template code.\n"
         );
  return;
}

Assistant:

static void Usage(const char* argv0, FILE* outfile) {
  fprintf(outfile, "USAGE: %s [-t<dir>] [-o<dir>] [-s<suffix>] [-f<filename>]"
          " [-n] [-d] [-q] <template_filename> ...\n", argv0);
  fprintf(outfile,
          "       -t<dir> --template_dir=<dir>  Root directory of templates\n"
          "       -o<dir> --header_dir=<dir>    Where to place output files\n"
          "       -s<suffix> --outputfile_suffix=<suffix>\n"
          "                                     outname = inname + suffix\n"
          "       -f<filename> --outputfile=<filename>\n"
          "                                     outname = filename (when given, \n"
          "                                     --header_dir is ignored)\n"
          "       -n --noheader                 Just check syntax, no output\n"
          "       -d --dump_templates           Cause templates dump contents\n"
          "       -q --nolog_info               Only log on error\n"
          "          --v=-1                     Obsolete, confusing synonym for -q\n"
          "       -h --help                     This help\n"
          "       -V --version                  Version information\n");
  fprintf(outfile, "\n"
          "This program checks the syntax of one or more google templates.\n"
          "By default (without -n) it also emits a header file to an output\n"
          "directory that defines all valid template keys.  This can be used\n"
          "in programs to minimze the probability of typos in template code.\n");
}